

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

TestAllTypes_NestedMessage *
google::protobuf::DynamicCastMessage<proto2_unittest::TestAllTypes_NestedMessage>(MessageLite *from)

{
  bool bVar1;
  TypeId a;
  TypeId b;
  MessageLite *from_local;
  
  if (from != (MessageLite *)0x0) {
    a = TypeId::Get<proto2_unittest::TestAllTypes_NestedMessage>();
    b = TypeId::Get(from);
    bVar1 = operator!=(a,b);
    if (!bVar1) {
      return (TestAllTypes_NestedMessage *)from;
    }
  }
  return (TestAllTypes_NestedMessage *)0x0;
}

Assistant:

const T* DynamicCastMessage(const MessageLite* from) {
  static_assert(std::is_base_of<MessageLite, T>::value, "");

  // We might avoid the call to T::GetClassData() altogether if T were to
  // expose the class data pointer.
  if (from == nullptr || TypeId::Get<T>() != TypeId::Get(*from)) {
    return nullptr;
  }

  return static_cast<const T*>(from);
}